

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astWhileContinueNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *psVar1;
  sysbvm_tuple_t sVar2;
  sysbvm_tuple_t continueLabel;
  sysbvm_tuple_t destination;
  sysbvm_tuple_t condition_00;
  sysbvm_tuple_t condition;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_40_5_caec50dc gcFrame;
  sysbvm_astWhileContinueWithNode_t **whileNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar1 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x28);
  memset(&condition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_CONTINUE_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&condition);
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  sVar2 = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  continueLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  destination = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),
             (sysbvm_tuple_t)gcFrameRecord.roots);
  if (*(long *)(*arguments + 0x28) == 0) {
    sysbvm_functionBytecodeAssembler_jump
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2);
  }
  else {
    condition_00 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                             (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
                              *(sysbvm_tuple_t *)(*arguments + 0x28));
    sysbvm_functionBytecodeAssembler_jumpIfFalse
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),condition_00,
               destination);
  }
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),sVar2);
  if (*(long *)(*arguments + 0x30) != 0) {
    sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue
              (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
               *(sysbvm_tuple_t *)(*arguments + 0x30),destination,continueLabel);
  }
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),continueLabel);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),continueLabel);
  if (*(long *)(*arguments + 0x38) != 0) {
    sysbvm_functionBytecodeDirectCompiler_compileASTNode
              (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar1,
               *(sysbvm_tuple_t *)(*arguments + 0x38));
  }
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),
             (sysbvm_tuple_t)gcFrameRecord.roots);
  sysbvm_functionBytecodeAssembler_addInstruction
            (*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),destination);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&condition);
  sVar2 = sysbvm_functionBytecodeAssembler_addLiteral
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar1 + 0x10),0x2f);
  return sVar2;
}

Assistant:

static sysbvm_tuple_t sysbvm_astWhileContinueNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astWhileContinueWithNode_t **whileNode = (sysbvm_astWhileContinueWithNode_t**)node;
    struct {
        sysbvm_tuple_t whileEntryLabel;
        sysbvm_tuple_t whileBodyLabel;
        sysbvm_tuple_t whileContinue;
        sysbvm_tuple_t whileMergeLabel;
        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.whileEntryLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.whileBodyLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.whileContinue = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);
    gcFrame.whileMergeLabel = sysbvm_functionBytecodeAssemblerInstruction_createLabel(context);

    // While condition block.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileEntryLabel);
    if((*whileNode)->conditionExpression)
    {
        sysbvm_tuple_t condition = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*whileNode)->conditionExpression);
        sysbvm_functionBytecodeAssembler_jumpIfFalse(context, (*compiler)->assembler, condition, gcFrame.whileMergeLabel);
    }
    else
    {
        sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.whileBodyLabel);
    }

    // While body.
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileBodyLabel);
    if((*whileNode)->bodyExpression)
        sysbvm_functionBytecodeDirectCompiler_compileASTNodeWithBreakAndContinue(context, *compiler, (*whileNode)->bodyExpression, gcFrame.whileMergeLabel, gcFrame.whileContinue);
    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.whileContinue);

    // While continue
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileContinue);
    if((*whileNode)->continueExpression)
        sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*whileNode)->continueExpression);

    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, gcFrame.whileEntryLabel);

    // While merge
    sysbvm_functionBytecodeAssembler_addInstruction((*compiler)->assembler, gcFrame.whileMergeLabel);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
}